

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_hash_map.hpp
# Opt level: O2

pair<ska::detailv3::sherwood_v3_table<std::pair<slang::BufferID,_unsigned_long>,_slang::BufferID,_std::hash<slang::BufferID>,_ska::detailv3::KeyOrValueHasher<slang::BufferID,_std::pair<slang::BufferID,_unsigned_long>,_std::hash<slang::BufferID>_>,_std::equal_to<slang::BufferID>,_ska::detailv3::KeyOrValueEquality<slang::BufferID,_std::pair<slang::BufferID,_unsigned_long>,_std::equal_to<slang::BufferID>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,_unsigned_long>_>,_16UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,_unsigned_long>_>,_16UL>_>::templated_iterator<std::pair<slang::BufferID,_unsigned_long>_>,_bool>
 __thiscall
ska::detailv3::
sherwood_v3_table<std::pair<slang::BufferID,unsigned_long>,slang::BufferID,std::hash<slang::BufferID>,ska::detailv3::KeyOrValueHasher<slang::BufferID,std::pair<slang::BufferID,unsigned_long>,std::hash<slang::BufferID>>,std::equal_to<slang::BufferID>,ska::detailv3::KeyOrValueEquality<slang::BufferID,std::pair<slang::BufferID,unsigned_long>,std::equal_to<slang::BufferID>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,unsigned_long>>,16ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,unsigned_long>>,16ul>>
::emplace_new_key<std::pair<slang::BufferID,unsigned_long>>
          (sherwood_v3_table<std::pair<slang::BufferID,unsigned_long>,slang::BufferID,std::hash<slang::BufferID>,ska::detailv3::KeyOrValueHasher<slang::BufferID,std::pair<slang::BufferID,unsigned_long>,std::hash<slang::BufferID>>,std::equal_to<slang::BufferID>,ska::detailv3::KeyOrValueEquality<slang::BufferID,std::pair<slang::BufferID,unsigned_long>,std::equal_to<slang::BufferID>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,unsigned_long>>,16ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,unsigned_long>>,16ul>>
           *this,int8_t distance_from_desired,EntryPointer current_entry,
          pair<slang::BufferID,_unsigned_long> *key)

{
  BufferID BVar1;
  uint uVar2;
  unsigned_long uVar3;
  undefined8 uVar4;
  long lVar5;
  unsigned_long uVar6;
  ulong uVar7;
  EntryPointer psVar8;
  EntryPointer psVar9;
  sherwood_v3_table<std::pair<slang::BufferID,unsigned_long>,slang::BufferID,std::hash<slang::BufferID>,ska::detailv3::KeyOrValueHasher<slang::BufferID,std::pair<slang::BufferID,unsigned_long>,std::hash<slang::BufferID>>,std::equal_to<slang::BufferID>,ska::detailv3::KeyOrValueEquality<slang::BufferID,std::pair<slang::BufferID,unsigned_long>,std::equal_to<slang::BufferID>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,unsigned_long>>,16ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,unsigned_long>>,16ul>>
  sVar10;
  char __tmp_3;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  pair<ska::detailv3::sherwood_v3_table<std::pair<slang::BufferID,_unsigned_long>,_slang::BufferID,_std::hash<slang::BufferID>,_ska::detailv3::KeyOrValueHasher<slang::BufferID,_std::pair<slang::BufferID,_unsigned_long>,_std::hash<slang::BufferID>_>,_std::equal_to<slang::BufferID>,_ska::detailv3::KeyOrValueEquality<slang::BufferID,_std::pair<slang::BufferID,_unsigned_long>,_std::equal_to<slang::BufferID>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,_unsigned_long>_>,_16UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,_unsigned_long>_>,_16UL>_>::templated_iterator<std::pair<slang::BufferID,_unsigned_long>_>,_bool>
  pVar14;
  pair<slang::BufferID,_unsigned_long> local_28;
  char cVar11;
  
  if ((*(long *)(this + 0x10) != 0) &&
     (this[0x19] !=
      (sherwood_v3_table<std::pair<slang::BufferID,unsigned_long>,slang::BufferID,std::hash<slang::BufferID>,ska::detailv3::KeyOrValueHasher<slang::BufferID,std::pair<slang::BufferID,unsigned_long>,std::hash<slang::BufferID>>,std::equal_to<slang::BufferID>,ska::detailv3::KeyOrValueEquality<slang::BufferID,std::pair<slang::BufferID,unsigned_long>,std::equal_to<slang::BufferID>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,unsigned_long>>,16ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,unsigned_long>>,16ul>>
       )distance_from_desired)) {
    uVar7 = *(long *)(this + 0x20) + 1;
    auVar12._8_4_ = (int)(uVar7 >> 0x20);
    auVar12._0_8_ = uVar7;
    auVar12._12_4_ = 0x45300000;
    lVar5 = *(long *)(this + 0x10) + 1;
    auVar13._8_4_ = (int)((ulong)lVar5 >> 0x20);
    auVar13._0_8_ = lVar5;
    auVar13._12_4_ = 0x45300000;
    if ((auVar12._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)uVar7) - 4503599627370496.0) <=
        (double)*(float *)(this + 0x1c) *
        ((auVar13._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0))) {
      cVar11 = current_entry->distance_from_desired;
      if (cVar11 < '\0') {
        uVar6 = key->second;
        *(undefined8 *)&current_entry->field_1 = *(undefined8 *)key;
        (current_entry->field_1).value.second = uVar6;
        current_entry->distance_from_desired = distance_from_desired;
LAB_00192b0d:
        *(long *)(this + 0x20) = *(long *)(this + 0x20) + 1;
        pVar14._9_7_ = (int7)(uVar7 >> 8);
        pVar14.second = true;
        pVar14.first.current = current_entry;
        return pVar14;
      }
      uVar4 = *(undefined8 *)key;
      uVar3 = key->second;
      current_entry->distance_from_desired = distance_from_desired;
      local_28.first.id = (uint32_t)uVar4;
      BVar1.id = (current_entry->field_1).value.first.id;
      (current_entry->field_1).value.first.id = local_28.first.id;
      uVar6 = (current_entry->field_1).value.second;
      (current_entry->field_1).value.second = uVar3;
      psVar8 = current_entry;
      do {
        uVar7 = (ulong)BVar1.id;
        sVar10 = (sherwood_v3_table<std::pair<slang::BufferID,unsigned_long>,slang::BufferID,std::hash<slang::BufferID>,ska::detailv3::KeyOrValueHasher<slang::BufferID,std::pair<slang::BufferID,unsigned_long>,std::hash<slang::BufferID>>,std::equal_to<slang::BufferID>,ska::detailv3::KeyOrValueEquality<slang::BufferID,std::pair<slang::BufferID,unsigned_long>,std::equal_to<slang::BufferID>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,unsigned_long>>,16ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,unsigned_long>>,16ul>>
                  )(cVar11 + '\x01');
        psVar9 = psVar8;
        while( true ) {
          psVar8 = psVar9 + 1;
          cVar11 = psVar8->distance_from_desired;
          local_28._4_4_ = SUB84((ulong)uVar4 >> 0x20,0);
          if (cVar11 < '\0') {
            local_28.first.id = BVar1.id;
            *(undefined8 *)&psVar9[1].field_1 = local_28._0_8_;
            psVar9[1].field_1.value.second = uVar6;
            psVar8->distance_from_desired = (int8_t)sVar10;
            goto LAB_00192b0d;
          }
          if (cVar11 < (char)sVar10) break;
          sVar10 = (sherwood_v3_table<std::pair<slang::BufferID,unsigned_long>,slang::BufferID,std::hash<slang::BufferID>,ska::detailv3::KeyOrValueHasher<slang::BufferID,std::pair<slang::BufferID,unsigned_long>,std::hash<slang::BufferID>>,std::equal_to<slang::BufferID>,ska::detailv3::KeyOrValueEquality<slang::BufferID,std::pair<slang::BufferID,unsigned_long>,std::equal_to<slang::BufferID>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,unsigned_long>>,16ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,unsigned_long>>,16ul>>
                    )((char)sVar10 + '\x01');
          psVar9 = psVar8;
          if (this[0x19] == sVar10) {
            local_28.first.id = (current_entry->field_1).value.first.id;
            (current_entry->field_1).value.first.id = BVar1.id;
            local_28.second = (current_entry->field_1).value.second;
            (current_entry->field_1).value.second = uVar6;
            key = &local_28;
            goto LAB_00192b2d;
          }
        }
        psVar8->distance_from_desired = (int8_t)sVar10;
        uVar2 = psVar9[1].field_1.value.first.id;
        psVar9[1].field_1.value.first.id = BVar1.id;
        uVar3 = psVar9[1].field_1.value.second;
        psVar9[1].field_1.value.second = uVar6;
        uVar6 = uVar3;
        BVar1.id = uVar2;
      } while( true );
    }
  }
LAB_00192b2d:
  sherwood_v3_table<std::pair<slang::BufferID,_unsigned_long>,_slang::BufferID,_std::hash<slang::BufferID>,_ska::detailv3::KeyOrValueHasher<slang::BufferID,_std::pair<slang::BufferID,_unsigned_long>,_std::hash<slang::BufferID>_>,_std::equal_to<slang::BufferID>,_ska::detailv3::KeyOrValueEquality<slang::BufferID,_std::pair<slang::BufferID,_unsigned_long>,_std::equal_to<slang::BufferID>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,_unsigned_long>_>,_16UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,_unsigned_long>_>,_16UL>_>
  ::grow((sherwood_v3_table<std::pair<slang::BufferID,_unsigned_long>,_slang::BufferID,_std::hash<slang::BufferID>,_ska::detailv3::KeyOrValueHasher<slang::BufferID,_std::pair<slang::BufferID,_unsigned_long>,_std::hash<slang::BufferID>_>,_std::equal_to<slang::BufferID>,_ska::detailv3::KeyOrValueEquality<slang::BufferID,_std::pair<slang::BufferID,_unsigned_long>,_std::equal_to<slang::BufferID>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,_unsigned_long>_>,_16UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,_unsigned_long>_>,_16UL>_>
          *)this);
  pVar14 = emplace<std::pair<slang::BufferID,unsigned_long>>(this,key);
  return pVar14;
}

Assistant:

emplace_new_key(int8_t distance_from_desired, EntryPointer current_entry, Key && key, Args &&... args)
    {
        using std::swap;
        if (num_slots_minus_one == 0 || distance_from_desired == max_lookups || num_elements + 1 > (num_slots_minus_one + 1) * static_cast<double>(_max_load_factor))
        {
            grow();
            return emplace(std::forward<Key>(key), std::forward<Args>(args)...);
        }
        else if (current_entry->is_empty())
        {
            current_entry->emplace(distance_from_desired, std::forward<Key>(key), std::forward<Args>(args)...);
            ++num_elements;
            return { { current_entry }, true };
        }
        value_type to_insert(std::forward<Key>(key), std::forward<Args>(args)...);
        swap(distance_from_desired, current_entry->distance_from_desired);
        swap(to_insert, current_entry->value);
        iterator result = { current_entry };
        for (++distance_from_desired, ++current_entry;; ++current_entry)
        {
            if (current_entry->is_empty())
            {
                current_entry->emplace(distance_from_desired, std::move(to_insert));
                ++num_elements;
                return { result, true };
            }
            else if (current_entry->distance_from_desired < distance_from_desired)
            {
                swap(distance_from_desired, current_entry->distance_from_desired);
                swap(to_insert, current_entry->value);
                ++distance_from_desired;
            }
            else
            {
                ++distance_from_desired;
                if (distance_from_desired == max_lookups)
                {
                    swap(to_insert, result.current->value);
                    grow();
                    return emplace(std::move(to_insert));
                }
            }
        }
    }